

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O2

void __thiscall helics::apps::Tracer::Tracer(Tracer *this,int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  string_view defaultAppName;
  
  defaultAppName._M_str = "tracer";
  defaultAppName._M_len = 6;
  App::App(&this->super_App,defaultAppName,argc,argv);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Tracer_00482f68;
  this->printMessage = false;
  this->allow_iteration = false;
  this->skiplog = false;
  (this->cFilt)._M_t.
  super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>._M_t.
  super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
  super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl = (CloningFilter *)0x0;
  CLI::std::_Deque_base<helics::Input,_std::allocator<helics::Input>_>::_Deque_base
            (&(this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>
            );
  (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->subkeys)._M_t._M_impl.super__Rb_tree_header;
  (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  CLI::std::_Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>::_Deque_base
            (&(this->endpoints).
              super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>);
  (this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->eptNames)._M_t._M_impl.super__Rb_tree_header;
  (this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  memset(&(this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x88);
  processArgs(this);
  initialSetup(this);
  return;
}

Assistant:

Tracer::Tracer(int argc, char* argv[]): App("tracer", argc, argv)
{
    processArgs();
    initialSetup();
}